

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::
    make<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
              (flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *args)

{
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this;
  proxy *dat;
  proxy *in_RDI;
  proxy *args_00;
  allocator_type<cs_impl::any::holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  
  args_00 = in_RDI;
  this = (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *)
         cs::
         allocator_type<cs_impl::any::holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>,64ul,cs_impl::default_allocator_provider>
         ::
         alloc<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                   (in_stack_ffffffffffffffe0,
                    (flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                     *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,cs_impl::any::holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>*>
                  (this,(int *)args_00,
                   (holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
                    **)in_RDI);
  any((any *)in_RDI,dat);
  return (any)args_00;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}